

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::generate_grad_ori_images(Sift *this,Octave *octave)

{
  int width_00;
  int height_00;
  size_type sVar1;
  __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  ImageBase *pIVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  reference __r;
  element_type *peVar5;
  float *pfVar6;
  element_type *peVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  float atan2f;
  float dy;
  float dx;
  float p1y;
  float m1y;
  float p1x;
  float m1x;
  int x;
  int y;
  int image_iter;
  Ptr ori;
  undefined1 local_48 [8];
  Ptr grad;
  ConstPtr img;
  size_t i;
  int height;
  int width;
  Octave *octave_local;
  Sift *this_local;
  
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::clear(&octave->grad);
  sVar1 = std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::size(&octave->img);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::reserve(&octave->grad,sVar1);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::clear(&octave->ori);
  sVar1 = std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::size(&octave->img);
  std::
  vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
  ::reserve(&octave->ori,sVar1);
  p_Var2 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ::operator[](&octave->img,0);
  pIVar3 = (ImageBase *)
           std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  width_00 = core::ImageBase::width(pIVar3);
  p_Var2 = (__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
           ::operator[](&octave->img,0);
  pIVar3 = (ImageBase *)
           std::__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Var2);
  height_00 = core::ImageBase::height(pIVar3);
  for (img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
               ::size(&octave->img),
      img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      < p_Var4; img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(img.
                              super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    __r = std::
          vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
          ::operator[](&octave->img,
                       (size_type)
                       img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    std::shared_ptr<core::Image<float>const>::shared_ptr<core::Image<float>,void>
              ((shared_ptr<core::Image<float>const> *)
               &grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               __r);
    core::Image<float>::create((Image<float> *)local_48,width_00,height_00,1);
    core::Image<float>::create((Image<float> *)&y,width_00,height_00,1);
    x = width_00 + 1;
    for (m1x = 1.4013e-45; (int)m1x < height_00 + -1; m1x = (float)((int)m1x + 1)) {
      for (p1x = 1.4013e-45; (int)p1x < width_00 + -1; p1x = (float)((int)p1x + 1)) {
        peVar5 = std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&grad.
                                  super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pfVar6 = core::Image<float>::at(peVar5,x + -1);
        fVar10 = *pfVar6;
        peVar5 = std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&grad.
                                  super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pfVar6 = core::Image<float>::at(peVar5,x + 1);
        fVar8 = *pfVar6;
        peVar5 = std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&grad.
                                  super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pfVar6 = core::Image<float>::at(peVar5,x - width_00);
        fVar9 = *pfVar6;
        peVar5 = std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&grad.
                                  super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        pfVar6 = core::Image<float>::at(peVar5,x + width_00);
        fVar8 = (fVar8 - fVar10) * 0.5;
        fVar9 = (*pfVar6 - fVar9) * 0.5;
        dVar11 = std::atan2((double)(ulong)(uint)fVar9,(double)(ulong)(uint)fVar8);
        fVar10 = SUB84(dVar11,0);
        dVar11 = std::sqrt((double)(ulong)(uint)(fVar8 * fVar8 + fVar9 * fVar9));
        peVar7 = std::
                 __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        pfVar6 = core::Image<float>::at(peVar7,x);
        *pfVar6 = SUB84(dVar11,0);
        if (fVar10 < 0.0) {
          fVar10 = fVar10 + 6.2831855;
        }
        peVar7 = std::
                 __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&y);
        pfVar6 = core::Image<float>::at(peVar7,x);
        *pfVar6 = fVar10;
        x = x + 1;
      }
      x = x + 2;
    }
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(&octave->grad,(value_type *)local_48);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::push_back(&octave->ori,(value_type *)&y);
    std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)&y);
    std::shared_ptr<core::Image<float>_>::~shared_ptr((shared_ptr<core::Image<float>_> *)local_48);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr
              ((shared_ptr<const_core::Image<float>_> *)
               &grad.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  return;
}

Assistant:

void
Sift::generate_grad_ori_images (Octave* octave)
{
    octave->grad.clear();
    octave->grad.reserve(octave->img.size());
    octave->ori.clear();
    octave->ori.reserve(octave->img.size());

    int const width = octave->img[0]->width();
    int const height = octave->img[0]->height();

    //std::cout << "Generating gradient and orientation images..." << std::endl;
    for (std::size_t i = 0; i < octave->img.size(); ++i)
    {
        core::FloatImage::ConstPtr img = octave->img[i];
        core::FloatImage::Ptr grad = core::FloatImage::create(width, height, 1);
        core::FloatImage::Ptr ori = core::FloatImage::create(width, height, 1);

        int image_iter = width + 1;
        for (int y = 1; y < height - 1; ++y, image_iter += 2)
            for (int x = 1; x < width - 1; ++x, ++image_iter)
            {
                float m1x = img->at(image_iter - 1);
                float p1x = img->at(image_iter + 1);
                float m1y = img->at(image_iter - width);
                float p1y = img->at(image_iter + width);
                float dx = 0.5f * (p1x - m1x);
                float dy = 0.5f * (p1y - m1y);

                float atan2f = std::atan2(dy, dx);
                grad->at(image_iter) = std::sqrt(dx * dx + dy * dy);
                ori->at(image_iter) = atan2f < 0.0f
                    ? atan2f + MATH_PI * 2.0f : atan2f;
            }
        octave->grad.push_back(grad);
        octave->ori.push_back(ori);
    }
}